

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O0

void __thiscall GrammarToken::set(GrammarToken *this,uint4 tp,char *ptr,int4 len)

{
  long lVar1;
  _Ios_Fmtflags _Var2;
  string *this_00;
  LowlevelError *this_01;
  allocator local_211;
  string local_210 [38];
  undefined1 local_1ea;
  allocator local_1e9;
  tokenvalue local_1e8;
  intb val;
  istringstream s;
  allocator local_49;
  string local_48 [8];
  string charstring;
  int4 len_local;
  char *ptr_local;
  uint4 tp_local;
  GrammarToken *this_local;
  
  this->type = tp;
  if (tp == 0x103) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,ptr,(long)len,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    std::__cxx11::istringstream::istringstream((istringstream *)&val,local_48,8);
    lVar1 = *(long *)(val + -0x18);
    _Var2 = std::operator|(_S_dec,_S_hex);
    _Var2 = std::operator|(_Var2,_S_oct);
    std::ios_base::unsetf((ios_base *)((long)&val + lVar1),_Var2);
    std::istream::operator>>(&val,(long *)&local_1e8.integer);
    this->value = local_1e8;
    std::__cxx11::istringstream::~istringstream((istringstream *)&val);
    std::__cxx11::string::~string(local_48);
  }
  else if (tp == 0x104) {
    if (len == 1) {
      this->value = (tokenvalue)(long)*ptr;
    }
    else {
      switch(ptr[1]) {
      case '0':
        (this->value).integer = 0;
        break;
      default:
        this->value = (tokenvalue)(long)ptr[1];
        break;
      case 'a':
        (this->value).integer = 7;
        break;
      case 'b':
        (this->value).integer = 8;
        break;
      case 'f':
        (this->value).integer = 0xc;
        break;
      case 'n':
        (this->value).integer = 10;
        break;
      case 'r':
        (this->value).integer = 0xd;
        break;
      case 't':
        (this->value).integer = 9;
        break;
      case 'v':
        (this->value).integer = 0xb;
      }
    }
  }
  else {
    if (1 < tp - 0x105) {
      this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"Bad internal grammar token set",&local_211);
      LowlevelError::LowlevelError(this_01,(string *)local_210);
      __cxa_throw(this_01,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    this_00 = (string *)operator_new(0x20);
    local_1ea = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,ptr,(long)len,&local_1e9);
    local_1ea = 0;
    (this->value).stringval = (string *)this_00;
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  return;
}

Assistant:

void GrammarToken::set(uint4 tp,char *ptr,int4 len)

{
  type = tp;
  switch(tp) {
  case integer:
    {
      string charstring(ptr,len);
      istringstream s(charstring);
      s.unsetf(ios::dec | ios::hex | ios::oct);
      intb val;
      s >> val;
      value.integer = (uintb)val;
    }
    break;
  case identifier:
  case stringval:
    value.stringval = new string(ptr,len);
    break;
  case charconstant:
    if (len==1)
      value.integer = (uintb)*ptr;
    else {			// Backslash
      switch(ptr[1]) {
      case 'n':
	value.integer = 10;
	break;
      case '0':
	value.integer = 0;
	break;
      case 'a':
	value.integer = 7;
	break;
      case 'b':
	value.integer = 8;
	break;
      case 't':
	value.integer = 9;
	break;
      case 'v':
	value.integer = 11;
	break;
      case 'f':
	value.integer = 12;
	break;
      case 'r':
	value.integer = 13;
	break;
      default:
	value.integer = (uintb)ptr[1];
	break;
      }
    }
    break;
  default:
    throw LowlevelError("Bad internal grammar token set");
  }
}